

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall Entity::Entity(Entity *this,int _hp,int _mp,int _atk)

{
  int _atk_local;
  int _mp_local;
  int _hp_local;
  Entity *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  this->hp = _hp;
  this->mp = _mp;
  this->hp_max = this->hp;
  this->mp_max = this->mp;
  this->atk = _atk;
  std::__cxx11::string::operator=((string *)&this->name,anon_var_dwarf_1358e);
  return;
}

Assistant:

Entity::Entity(int _hp,int _mp,int _atk){
    hp = _hp;
    mp = _mp;
    hp_max = hp;
    mp_max = mp;
    atk = _atk;
    name = "勇者";
}